

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

string * testing::internal::StringStreamToString(string *__return_storage_ptr__,stringstream *ss)

{
  long lVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  char *local_78;
  char *ch;
  char *end;
  char *start;
  string *str;
  stringstream *ss_local;
  string *result;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::stringstream::str();
  local_78 = (char *)std::__cxx11::string::c_str();
  lVar1 = std::__cxx11::string::length();
  pcVar2 = local_78 + lVar1;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (; local_78 != pcVar2; local_78 = local_78 + 1) {
    if (*local_78 == '\0') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\0");
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*local_78);
    }
  }
  std::__cxx11::string::~string((string *)&result);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringStreamToString(::std::stringstream* ss) {
			const ::std::string& str = ss->str();
			const char* const start = str.c_str();
			const char* const end = start + str.length();

			std::string result;
			result.reserve(2 * (end - start));
			for (const char* ch = start; ch != end; ++ch) {
				if (*ch == '\0') {
					result += "\\0";  // Replaces NUL with "\\0";
				}
				else {
					result += *ch;
				}
			}

			return result;
		}